

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_version_number.cpp
# Opt level: O1

uint ON_VersionNumberFromYearMonthDateFormat
               (uint version_number_major,uint YYYYMMDDn_version_number)

{
  bool bVar1;
  uint uVar2;
  
  bVar1 = ON_VersionNumberIsYearMonthDateFormat(version_number_major,YYYYMMDDn_version_number);
  if (bVar1) {
    uVar2 = 5;
    if (YYYYMMDDn_version_number % 10 - 1 < 8) {
      uVar2 = YYYYMMDDn_version_number % 10;
    }
    if (version_number_major != 0) {
      uVar2 = version_number_major;
    }
    uVar2 = ON_VersionNumberConstruct
                      (uVar2,0,YYYYMMDDn_version_number / 100000,
                       YYYYMMDDn_version_number / 1000 + (YYYYMMDDn_version_number / 100000) * -100,
                       YYYYMMDDn_version_number / 10 + (YYYYMMDDn_version_number / 1000) * -100,0);
    return uVar2;
  }
  return 0;
}

Assistant:

unsigned int ON_VersionNumberFromYearMonthDateFormat(
  unsigned int version_number_major,
  unsigned int YYYYMMDDn_version_number
  )
{
  unsigned int version_number = 0;
  if ( ON_VersionNumberIsYearMonthDateFormat(version_number_major,YYYYMMDDn_version_number) )
  {
    // convert old format to new format
    unsigned int n = (YYYYMMDDn_version_number % 10);
    unsigned int day_of_month = (YYYYMMDDn_version_number/10) % 100;
    unsigned int month = (YYYYMMDDn_version_number/1000) % 100;
    unsigned int year = (YYYYMMDDn_version_number/100000);

    unsigned int major_version = (version_number_major > 0 )
                               ? version_number_major
                               : ((n > 0 && n < 9) ? n : 5);
    unsigned int minor_version = 0;
    unsigned int branch = 0; // 0 = developer
    version_number = ON_VersionNumberConstruct(
      major_version,
      minor_version,
      year,
      month,
      day_of_month,
      branch
      );
  }
  return version_number;
}